

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::CommandDiagGetQuery
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aAddr,uint64_t aDiagDataFlags)

{
  _func_void *p_Var1;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  CommissionerSafe *local_78;
  _Any_data local_70;
  long local_60;
  undefined8 uStack_58;
  string local_50 [32];
  uint64_t local_30;
  
  local_78 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_70,aHandler);
  std::__cxx11::string::string(local_50,(string *)aAddr);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_30 = aDiagDataFlags;
  p_Var1 = (_func_void *)operator_new(0x50);
  *(CommissionerSafe **)p_Var1 = local_78;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_58;
  if (local_60 != 0) {
    *(void **)(p_Var1 + 8) = local_70._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_70._8_8_;
    *(long *)(p_Var1 + 0x18) = local_60;
    local_60 = 0;
    uStack_58 = 0;
  }
  std::__cxx11::string::string((string *)(p_Var1 + 0x28),local_50);
  *(uint64_t *)(p_Var1 + 0x48) = local_30;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:554:22)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:554:22)>
             ::_M_manager;
  local_98._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  CommandDiagGetQuery(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)
  ::$_0::~__0((__0 *)&local_78);
  return;
}

Assistant:

void CommissionerSafe::CommandDiagGetQuery(ErrorHandler aHandler, const std::string &aAddr, uint64_t aDiagDataFlags)
{
    PushAsyncRequest([=]() { mImpl->CommandDiagGetQuery(aHandler, aAddr, aDiagDataFlags); });
}